

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<bool,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>
::doAnalysis(std::function<void(wasm::Function*,bool&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm
::Function*,bool,std::less<wasm::Function*>,std::allocator<std::pair<wasm::
Function*const,bool>>>&,std::function<void(wasm::Function__bool__>_
          (void *this,Module *module,Map *map,Func *work)

{
  Func *work_local;
  Map *map_local;
  Module *module_local;
  Mapper *this_local;
  
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>::WalkerPass
            ((WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_> *)this);
  *(undefined ***)this = &PTR__Mapper_030995f0;
  *(Module **)((long)this + 0x130) = module;
  *(Map **)((long)this + 0x138) = map;
  std::function<void_(wasm::Function_*,_bool_&)>::function
            ((function<void_(wasm::Function_*,_bool_&)> *)((long)this + 0x140),
             (function<void_(wasm::Function_*,_bool_&)> *)work);
  return;
}

Assistant:

Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}